

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O1

int __thiscall
miniros::MessageEvent<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>::init
          (MessageEvent<const_rosgraph_msgs::Clock_<std::allocator<void>_>_> *this,EVP_PKEY_CTX *ctx
          )

{
  function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()> *pfVar1;
  TimeBase<miniros::Time,_miniros::Duration> in_RCX;
  undefined8 *in_RDX;
  bool in_R8B;
  function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()> *in_R9;
  
  (this->message_).
  super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)ctx;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->message_).
              super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ctx + 8));
  (this->connection_header_).
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)*in_RDX;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->connection_header_).
              super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDX + 1));
  (this->receipt_time_).super_TimeBase<miniros::Time,_miniros::Duration> = in_RCX;
  this->nonconst_need_copy_ = in_R8B;
  pfVar1 = std::function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()>::
           operator=(&this->create_,in_R9);
  return (int)pfVar1;
}

Assistant:

void init(const ConstMessagePtr& message, const std::shared_ptr<M_string>& connection_header, Time receipt_time, bool nonconst_need_copy, const CreateFunction& create)
  {
    message_ = message;
    connection_header_ = connection_header;
    receipt_time_ = receipt_time;
    nonconst_need_copy_ = nonconst_need_copy;
    create_ = create;
  }